

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyBase64Decode(char *zB64,sxu32 nLen,ProcConsumer xConsumer,void *pUserData)

{
  int iVar1;
  bool bVar2;
  byte local_52;
  byte local_51;
  byte local_50;
  uchar zOut [10];
  sxi32 rc;
  sxu32 z;
  sxu32 y;
  sxu32 x;
  sxu32 w;
  sxu32 n;
  void *pUserData_local;
  ProcConsumer xConsumer_local;
  sxu32 nLen_local;
  char *zB64_local;
  
  xConsumer_local._4_4_ = nLen;
  while( true ) {
    bVar2 = false;
    if (xConsumer_local._4_4_ != 0) {
      bVar2 = zB64[xConsumer_local._4_4_ - 1] == '=';
    }
    if (!bVar2) break;
    xConsumer_local._4_4_ = xConsumer_local._4_4_ - 1;
  }
  for (x = 0; x + 3 < xConsumer_local._4_4_; x = x + 4) {
    zOut._6_4_ = SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 3] & 0x7f)];
    local_52 = (byte)((SyBase64Decode::aBase64Trans[(int)((int)zB64[x] & 0x7f)] & 0x3f) << 2) |
               (byte)(SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 1] & 0x7f)] >> 4) & 3;
    local_51 = (byte)((SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 1] & 0x7f)] & 0xf) << 4) |
               (byte)(SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 2] & 0x7f)] >> 2) & 0xf;
    local_50 = (byte)((SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 2] & 0x7f)] & 3) << 6) |
               (byte)zOut._6_4_ & 0x3f;
    iVar1 = (*xConsumer)(&local_52,3,pUserData);
    if (iVar1 != 0) {
      return -10;
    }
    zOut[2] = '\0';
    zOut[3] = '\0';
    zOut[4] = '\0';
    zOut[5] = '\0';
  }
  if (x + 2 < xConsumer_local._4_4_) {
    local_52 = (byte)((SyBase64Decode::aBase64Trans[(int)((int)zB64[x] & 0x7f)] & 0x3f) << 2) |
               (byte)(SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 1] & 0x7f)] >> 4) & 3;
    local_51 = (byte)((SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 1] & 0x7f)] & 0xf) << 4) |
               (byte)(SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 2] & 0x7f)] >> 2) & 0xf;
    iVar1 = (*xConsumer)(&local_52,2,pUserData);
    if (iVar1 != 0) {
      return -10;
    }
  }
  else if (x + 1 < xConsumer_local._4_4_) {
    local_52 = (byte)((SyBase64Decode::aBase64Trans[(int)((int)zB64[x] & 0x7f)] & 0x3f) << 2) |
               (byte)(SyBase64Decode::aBase64Trans[(int)((int)zB64[x + 1] & 0x7f)] >> 4) & 3;
    iVar1 = (*xConsumer)(&local_52,1,pUserData);
    if (iVar1 != 0) {
      return -10;
    }
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 SyBase64Decode(const char *zB64, sxu32 nLen, ProcConsumer xConsumer, void *pUserData)
{
	static const sxu32 aBase64Trans[] = {
	0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 
	0, 0, 0, 0, 0, 62, 0, 0, 0, 63, 52, 53, 54, 55, 56, 57, 58, 59, 60, 61, 0, 0, 0, 0, 0, 0, 0, 0, 1, 2, 3, 4, 
	5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15, 16, 17, 18, 19, 20, 21, 22, 23, 24, 25, 0, 0, 0, 0, 0, 0, 26, 27, 
	28, 29, 30, 31, 32, 33, 34, 35, 36, 37, 38, 39, 40, 41, 42, 43, 44, 45, 46, 47, 48, 49, 50, 51, 0, 0, 
	0, 0, 0
	};
	sxu32 n, w, x, y, z;
	sxi32 rc;
	unsigned char zOut[10];
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zB64) || xConsumer == 0 ){
		return SXERR_EMPTY;
	}
#endif
	while(nLen > 0 && zB64[nLen - 1] == '=' ){
		nLen--;
	}
	for( n = 0 ; n+3<nLen ; n += 4){
		w = aBase64Trans[zB64[n] & 0x7F];
		x = aBase64Trans[zB64[n+1] & 0x7F];
		y = aBase64Trans[zB64[n+2] & 0x7F];
		z = aBase64Trans[zB64[n+3] & 0x7F];
		zOut[0] = ((w<<2) & 0xFC) | ((x>>4) & 0x03);
		zOut[1] = ((x<<4) & 0xF0) | ((y>>2) & 0x0F);
		zOut[2] = ((y<<6) & 0xC0) | (z & 0x3F);

		rc = xConsumer((const void *)zOut, sizeof(unsigned char)*3, pUserData);
		if( rc != SXRET_OK ){ return SXERR_ABORT;}
	}
	if( n+2 < nLen ){
		w = aBase64Trans[zB64[n] & 0x7F];
		x = aBase64Trans[zB64[n+1] & 0x7F];
		y = aBase64Trans[zB64[n+2] & 0x7F];

		zOut[0] = ((w<<2) & 0xFC) | ((x>>4) & 0x03);
		zOut[1] = ((x<<4) & 0xF0) | ((y>>2) & 0x0F);

		rc = xConsumer((const void *)zOut, sizeof(unsigned char)*2, pUserData);
		if( rc != SXRET_OK ){ return SXERR_ABORT;}
	}else if( n+1 < nLen ){
		w = aBase64Trans[zB64[n] & 0x7F];
		x = aBase64Trans[zB64[n+1] & 0x7F];

		zOut[0] = ((w<<2) & 0xFC) | ((x>>4) & 0x03);

		rc = xConsumer((const void *)zOut, sizeof(unsigned char)*1, pUserData);
		if( rc != SXRET_OK ){ return SXERR_ABORT;}
	}
	return SXRET_OK;
}